

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O1

semantic_value_type __thiscall Centaurus::Stage3Runner::reduce(Stage3Runner *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  unsigned_long uVar4;
  long lVar5;
  pointer pCVar6;
  pointer pCVar7;
  size_type *psVar8;
  long *plVar9;
  long lVar10;
  semantic_value_type sVar11;
  CSTMarker *marker;
  CSTMarker *marker_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_> tags;
  unsigned_long *values_next_it;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> starts;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> ends;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  local_a0;
  long local_88;
  CSTMarker *local_80;
  CSTMarker *local_78;
  long local_70;
  unsigned_long *local_68;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> local_60;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> local_48;
  
  psVar8 = (size_type *)acquire_bank(this);
  if (psVar8 == (size_type *)0x0) {
    __assert_fail("bank_ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x23,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::vector
            (&local_60,*psVar8,(value_type *)&local_48,(allocator_type *)&local_b8);
  memcpy(local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
         _M_impl.super__Vector_impl_data._M_start,psVar8 + 1,
         (long)local_60.
               super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_60.
               super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
               _M_impl.super__Vector_impl_data._M_start);
  pCVar7 = local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar6 = local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (semantic_value_type *)0x0;
  std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::vector
            (&local_48,
             *(size_type *)
              ((long)psVar8 +
              (long)local_60.
                    super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
              (8 - (long)local_60.
                         super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>
                         ._M_impl.super__Vector_impl_data._M_start)),(value_type *)&local_b8,
             (allocator_type *)&local_a0);
  if (local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("ends.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x28,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  lVar5 = -(long)pCVar6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,*(size_type *)((long)psVar8 + (long)pCVar7 + lVar5 + 0x10),
             (allocator_type *)&local_a0);
  memcpy(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,(void *)((long)psVar8 + (long)pCVar7 + lVar5 + 0x18),
         (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  if ((*local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != 0) ||
     ((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 8)) {
    __assert_fail("values[0] == 0 && values.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x2b,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>::
  vector(&local_a0,*(size_type *)((long)psVar8 + (long)pCVar7 + lVar5 + 0x20),
         (allocator_type *)&local_68);
  memcpy(local_a0.
         super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
         ._M_impl.super__Vector_impl_data._M_start,
         (void *)((long)psVar8 + (long)pCVar7 + lVar5 + 0x28),
         (long)local_a0.
               super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_a0.
               super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               ._M_impl.super__Vector_impl_data._M_start);
  iVar3 = this->m_current_bank;
  while( true ) {
    if ((long)iVar3 != -1) {
      LOCK();
      *(undefined4 *)
       ((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window +
       (long)iVar3 * 8 + 4) = 0;
      UNLOCK();
      this->m_current_bank = -1;
    }
    plVar9 = (long *)acquire_bank(this);
    if (plVar9 == (long *)0x0) break;
    local_70 = *plVar9;
    marker = (CSTMarker *)(plVar9 + local_70 + 2);
    marker_00 = (CSTMarker *)(plVar9 + 1);
    local_88 = plVar9[local_70 + 1];
    local_68 = (unsigned_long *)(plVar9 + local_70 + local_88 + 3);
    uVar4 = local_68[-1];
    lVar5 = plVar9[local_70 + local_88 + uVar4 + 3];
    local_80 = marker;
    local_78 = marker_00;
    if (lVar5 != 0) {
      lVar1 = local_70 * 8;
      lVar2 = local_88 * 8;
      lVar10 = 0;
      do {
        iVar3 = *(int *)((long)plVar9 + lVar10 + uVar4 * 8 + lVar1 + lVar2 + 0x20);
        if (iVar3 == 0) {
          if (local_60.
              super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_60.
              super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("!starts.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                          ,0x58,"semantic_value_type Centaurus::Stage3Runner::reduce()");
          }
          NonRecursiveReductionRunner::reduce_by_end_marker
                    (&this->super_NonRecursiveReductionRunner,marker,&local_60,&local_b8,&local_a0);
          marker = marker + 1;
        }
        else if (iVar3 == -1) {
          NonRecursiveReductionRunner::push_start_marker(marker_00,&local_60,&local_a0);
          marker_00 = marker_00 + 1;
        }
        else {
          if (iVar3 < 1) {
            __assert_fail("detail::isValueTag(cur_tag)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                          ,0x5c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
          }
          append_value<unsigned_long_const*>(&local_68,iVar3,&local_b8,&local_a0);
        }
        lVar10 = lVar10 + 4;
      } while (lVar5 << 2 != lVar10);
    }
    if (marker_00 != local_78 + local_70) {
      __assert_fail("starts_next_it == starts_next.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                    ,0x61,"semantic_value_type Centaurus::Stage3Runner::reduce()");
    }
    if (marker != local_80 + local_88) {
      __assert_fail("ends_next_it == ends_next.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                    ,0x62,"semantic_value_type Centaurus::Stage3Runner::reduce()");
    }
    iVar3 = this->m_current_bank;
  }
  if (local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("starts.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6b,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  if (local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("ends.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  if (8 < (ulong)((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("values.size() <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6d,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  if ((ulong)((long)local_a0.
                    super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_a0.
                   super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 5) {
    if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      sVar11 = 0;
    }
    else {
      sVar11 = *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (local_a0.
        super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.
                      super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (semantic_value_type *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return sVar11;
  }
  __assert_fail("tags.size() <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                ,0x6e,"semantic_value_type Centaurus::Stage3Runner::reduce()");
}

Assistant:

semantic_value_type reduce()
  {
#if PYCENTAURUS
    auto bank_ptr = reinterpret_cast<uint64_t*>(acquire_bank());
    assert(bank_ptr != nullptr);
    std::vector<CSTMarker> starts(*bank_ptr++, CSTMarker(0));
    std::memcpy(starts.data(), bank_ptr, starts.size()*sizeof(CSTMarker));
    bank_ptr += starts.size();
    std::vector<CSTMarker> ends(*bank_ptr++, CSTMarker(0));
    assert(ends.empty());
    std::vector<semantic_value_type> values(*bank_ptr++);
    std::memcpy(values.data(), bank_ptr, values.size()*sizeof(semantic_value_type));
    assert(values[0] == 0 && values.size() == 1);
    bank_ptr += values.size();
    std::vector<detail::StackEntryTag> tags(*bank_ptr++);
    std::memcpy(tags.data(), bank_ptr, tags.size()*sizeof(detail::StackEntryTag));
#else
    auto bank_base_ptr = reinterpret_cast<std::tuple<std::vector<CSTMarker>,
                                                     std::vector<CSTMarker>,
                                                     std::vector<semantic_value_type>,
                                                     std::vector<detail::StackEntryTag>>**>(acquire_bank());
    assert(bank_base_ptr != nullptr);
    auto& stack_tuple_base = **bank_base_ptr;
    auto& starts = std::get<0>(stack_tuple_base);
    auto& ends   = std::get<1>(stack_tuple_base);
    auto& values = std::get<2>(stack_tuple_base);
    auto& tags   = std::get<3>(stack_tuple_base);
#endif
    release_bank();

    void *current_bank;
    while ((current_bank = acquire_bank()) != nullptr) {
#if PYCENTAURUS
      auto bank_ptr = reinterpret_cast<uint64_t*>(current_bank);
      detail::ConstPtrRange<CSTMarker> starts_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += starts_next.size() + 1;
      detail::ConstPtrRange<CSTMarker> ends_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += ends_next.size() + 1;
      detail::ConstPtrRange<semantic_value_type> values_next(bank_ptr + 1, bank_ptr[0]);
      bank_ptr += values_next.size() + 1;
      detail::ConstPtrRange<detail::StackEntryTag> tags_next(reinterpret_cast<detail::StackEntryTag*>(bank_ptr + 1), bank_ptr[0]);
#else
      auto& stack_tuple = **reinterpret_cast<std::decay<decltype(stack_tuple_base)>::type**>(current_bank);
      auto& starts_next = std::get<0>(stack_tuple);
      auto& ends_next   = std::get<1>(stack_tuple);
      auto& values_next = std::get<2>(stack_tuple);
      auto& tags_next   = std::get<3>(stack_tuple);
#endif
      auto starts_next_it = starts_next.begin();
      auto ends_next_it   = ends_next.begin();
      auto values_next_it = values_next.begin();
      for (auto cur_tag : tags_next) {
        switch (cur_tag) {
        case detail::StackEntryTag::START_MARKER:
          push_start_marker(*starts_next_it++, starts, tags);
          break;
        case detail::StackEntryTag::END_MARKER: {
          assert(!starts.empty());
          reduce_by_end_marker(*ends_next_it++, starts, values, tags);
        } break;
        default:
          assert(detail::isValueTag(cur_tag));
          append_value(values_next_it, static_cast<int>(cur_tag), values, tags);
          break;
        }
      }
      assert(starts_next_it == starts_next.end());
      assert(ends_next_it == ends_next.end());
#if !PYCENTAURUS
      assert(values_next_it == values_next.end());
#endif
#if !PYCENTAURUS
      delete &stack_tuple;
#endif
      release_bank();
    }
    assert(starts.empty());
    assert(ends.empty());
    assert(values.size() <= 1);
    assert(tags.size() <= 1);

    auto result = (values.empty()) ? 0 : std::move(values.front());
#if !PYCENTAURUS
    delete &stack_tuple_base;
#endif
    return result;
  }